

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3tokDequoteArray(int argc,char **argv,char ***pazDequote)

{
  size_t sVar1;
  char **ppcVar2;
  char **ppcStack_40;
  int n;
  char *pSpace;
  char **azDequote;
  int local_28;
  int nByte;
  int i;
  int rc;
  char ***pazDequote_local;
  char **argv_local;
  int argc_local;
  
  nByte = 0;
  if (argc == 0) {
    *pazDequote = (char **)0x0;
  }
  else {
    azDequote._4_4_ = 0;
    for (local_28 = 0; local_28 < argc; local_28 = local_28 + 1) {
      sVar1 = strlen(argv[local_28]);
      azDequote._4_4_ = (int)sVar1 + 1 + azDequote._4_4_;
    }
    ppcVar2 = (char **)sqlite3_malloc64((long)argc * 8 + (long)azDequote._4_4_);
    *pazDequote = ppcVar2;
    if (ppcVar2 == (char **)0x0) {
      nByte = 7;
    }
    else {
      ppcStack_40 = ppcVar2 + argc;
      for (local_28 = 0; local_28 < argc; local_28 = local_28 + 1) {
        sVar1 = strlen(argv[local_28]);
        ppcVar2[local_28] = (char *)ppcStack_40;
        memcpy(ppcStack_40,argv[local_28],(long)((int)sVar1 + 1));
        sqlite3Fts3Dequote((char *)ppcStack_40);
        ppcStack_40 = (char **)((long)ppcStack_40 + (long)((int)sVar1 + 1));
      }
    }
  }
  return nByte;
}

Assistant:

static int fts3tokDequoteArray(
  int argc,                       /* Number of elements in argv[] */
  const char * const *argv,       /* Input array */
  char ***pazDequote              /* Output array */
){
  int rc = SQLITE_OK;             /* Return code */
  if( argc==0 ){
    *pazDequote = 0;
  }else{
    int i;
    int nByte = 0;
    char **azDequote;

    for(i=0; i<argc; i++){
      nByte += (int)(strlen(argv[i]) + 1);
    }

    *pazDequote = azDequote = sqlite3_malloc64(sizeof(char *)*argc + nByte);
    if( azDequote==0 ){
      rc = SQLITE_NOMEM;
    }else{
      char *pSpace = (char *)&azDequote[argc];
      for(i=0; i<argc; i++){
        int n = (int)strlen(argv[i]);
        azDequote[i] = pSpace;
        memcpy(pSpace, argv[i], n+1);
        sqlite3Fts3Dequote(pSpace);
        pSpace += (n+1);
      }
    }
  }

  return rc;
}